

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O0

Matrix44<float> * __thiscall Imath_3_2::Quat<float>::toMatrix44(Quat<float> *this)

{
  float *in_RSI;
  Matrix44<float> *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = in_RSI[2] * in_RSI[2] + in_RSI[3] * in_RSI[3];
  fVar2 = in_RSI[3] * in_RSI[3] + in_RSI[1] * in_RSI[1];
  fVar3 = in_RSI[2] * in_RSI[2] + in_RSI[1] * in_RSI[1];
  Matrix44<float>::Matrix44
            (in_RDI,1.0 - (fVar1 + fVar1),(in_RSI[1] * in_RSI[2] + in_RSI[3] * *in_RSI) * 2.0,
             (in_RSI[3] * in_RSI[1] + -(in_RSI[2] * *in_RSI)) * 2.0,0.0,
             (in_RSI[1] * in_RSI[2] + -(in_RSI[3] * *in_RSI)) * 2.0,1.0 - (fVar2 + fVar2),
             (in_RSI[2] * in_RSI[3] + in_RSI[1] * *in_RSI) * 2.0,0.0,
             (in_RSI[3] * in_RSI[1] + in_RSI[2] * *in_RSI) * 2.0,
             (in_RSI[2] * in_RSI[3] + -(in_RSI[1] * *in_RSI)) * 2.0,1.0 - (fVar3 + fVar3),0.0,0.0,
             0.0,0.0,1.0);
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE constexpr inline Matrix44<T>
Quat<T>::toMatrix44 () const IMATH_NOEXCEPT
{
    return Matrix44<T> (
        1 - 2 * (v.y * v.y + v.z * v.z),
        2 * (v.x * v.y + v.z * r),
        2 * (v.z * v.x - v.y * r),
        0,
        2 * (v.x * v.y - v.z * r),
        1 - 2 * (v.z * v.z + v.x * v.x),
        2 * (v.y * v.z + v.x * r),
        0,
        2 * (v.z * v.x + v.y * r),
        2 * (v.y * v.z - v.x * r),
        1 - 2 * (v.y * v.y + v.x * v.x),
        0,
        0,
        0,
        0,
        1);
}